

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.h
# Opt level: O0

void __thiscall
BayesianGameIdenticalPayoff::SetUtility
          (BayesianGameIdenticalPayoff *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypeIndices,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indActionIndices,double u)

{
  Index IVar1;
  uint uVar2;
  undefined8 in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  undefined8 in_XMM0_Qa;
  BayesianGameBase *this_00;
  
  this_00 = (BayesianGameBase *)
            in_RDI[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  IVar1 = BayesianGameBase::IndividualToJointTypeIndices(this_00,in_RDI);
  uVar2 = (**(code **)((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0xe))(in_RDI,in_RDX);
  (*(this_00->super_Interface_ProblemToPolicyDiscretePure).super_Interface_ProblemToPolicyDiscrete.
    _vptr_Interface_ProblemToPolicyDiscrete[1])(in_XMM0_Qa,this_00,(ulong)IVar1,(ulong)uVar2);
  return;
}

Assistant:

void SetUtility(const std::vector<Index>& indTypeIndices, 
                const std::vector<Index>& indActionIndices,const double u )
        {
#if DEBUG_CHECKNANINF
            if(!std::isfinite(u))
                throw(E("BayesianGameIdenticalPayoff trying to set nan or inf utility"));
#endif
            _m_utilFunction->Set(
                IndividualToJointTypeIndices(indTypeIndices),
                IndividualToJointActionIndices(indActionIndices),
                u);
        }